

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O1

int __thiscall FParseContext::GetToken(FParseContext *this,char **sourcep,FParseToken *yylval)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  char cVar7;
  uint uVar8;
  int *piVar9;
  char *pcVar10;
  ulong uVar11;
  double dVar12;
  int buildup;
  char token [80];
  int local_8c;
  undefined8 local_88;
  
  pcVar10 = *sourcep;
  iVar6 = this->SourceLine;
LAB_0046f7ca:
  *sourcep = pcVar10 + 1;
  cVar7 = *pcVar10;
  uVar8 = (uint)cVar7;
  iVar2 = isspace(uVar8);
  if ((cVar7 != '\0') && (iVar2 != 0)) {
    pcVar5 = pcVar10 + 2;
    do {
      pcVar10 = pcVar5;
      if ((char)uVar8 == '\n') {
        iVar6 = iVar6 + 1;
        this->SourceLine = iVar6;
      }
      *sourcep = pcVar10;
      cVar7 = pcVar10[-1];
      uVar8 = (uint)cVar7;
      iVar2 = isspace(uVar8);
    } while ((cVar7 != '\0') && (pcVar5 = pcVar10 + 1, iVar2 != 0));
    pcVar10 = pcVar10 + -1;
  }
  cVar7 = (char)uVar8;
  if (cVar7 == '\0') {
    return 0;
  }
  pcVar5 = pcVar10 + 1;
  if (uVar8 - 0x30 < 10) {
    if (cVar7 == '0') {
      *sourcep = pcVar10 + 2;
      if ((pcVar10[1] & 0xdfU) == 0x58) {
        lVar3 = strtol(pcVar10 + 2,sourcep,0x10);
        yylval->val = (int)lVar3;
        return this->TokenTrans[9];
      }
      *sourcep = pcVar5;
    }
    pcVar10 = *sourcep;
    *sourcep = pcVar10 + -1;
    lVar3 = strtol(pcVar10 + -1,(char **)&local_88,10);
    yylval->val = (int)lVar3;
    if (*(char *)CONCAT71(local_88._1_7_,(char)local_88) == '.') {
      dVar12 = strtod(*sourcep,sourcep);
      yylval->fval = dVar12;
      lVar3 = 0x28;
    }
    else {
      *sourcep = (char *)CONCAT71(local_88._1_7_,(char)local_88);
      lVar3 = 0x24;
    }
    return *(int *)((long)this->TokenTrans + lVar3);
  }
  iVar2 = isalpha(uVar8);
  if (iVar2 == 0) {
    uVar8 = uVar8 & 0xff;
    if (0x5a < uVar8) {
      if (0x7a < uVar8) {
        if (uVar8 != 0x7b) {
          if (uVar8 == 0x7c) {
            *sourcep = pcVar10 + 2;
            if (pcVar10[1] != '=') {
              *sourcep = pcVar5;
              return this->TokenTrans[1];
            }
            return this->TokenTrans[0x14];
          }
          if (uVar8 != 0x7d) {
            return 0;
          }
LAB_0046f944:
          return this->TokenTrans[0xe];
        }
LAB_0046fce0:
        return this->TokenTrans[0xf];
      }
      if (uVar8 == 0x5b) {
LAB_0046fcfe:
        return this->TokenTrans[0x12];
      }
      if (uVar8 != 0x5d) {
LAB_0046f910:
        if (uVar8 == 0x5e) {
          return this->TokenTrans[2];
        }
        return 0;
      }
LAB_0046fcf5:
      return this->TokenTrans[0x13];
    }
    switch(uVar8) {
    case 0x22:
      uVar11 = 0;
      while( true ) {
        pcVar10 = *sourcep;
        *sourcep = pcVar10 + 1;
        cVar7 = *pcVar10;
        if ((cVar7 == '\0') || (cVar7 == '\"')) break;
        yylval->sym[uVar11] = cVar7;
        uVar11 = uVar11 + 1;
      }
      yylval->sym[uVar11 & 0xffffffff] = '\0';
      return this->TokenTrans[0x19];
    case 0x23:
      iVar6 = strncasecmp(pcVar5,"include",7);
      if (iVar6 == 0) {
        *sourcep = pcVar10 + 8;
        return this->TokenTrans[0x1a];
      }
      iVar6 = strncasecmp(pcVar5,"define",6);
      if (iVar6 == 0) {
        *sourcep = pcVar10 + 7;
        return this->TokenTrans[0x1b];
      }
      if (uVar8 < 0x5b) {
        switch(uVar8) {
        case 0x25:
          goto switchD_0046f86f_caseD_25;
        case 0x26:
          goto switchD_0046f86f_caseD_26;
        default:
          return 0;
        case 0x28:
          goto switchD_0046f86f_caseD_28;
        case 0x29:
          goto switchD_0046f86f_caseD_29;
        case 0x2a:
          goto switchD_0046f86f_caseD_2a;
        case 0x2b:
          goto switchD_0046f86f_caseD_2b;
        case 0x2c:
          goto switchD_0046f86f_caseD_2c;
        case 0x2d:
          goto switchD_0046f86f_caseD_2d;
        case 0x3a:
          goto switchD_0046f86f_caseD_3a;
        case 0x3b:
          goto switchD_0046f86f_caseD_3b;
        case 0x3d:
          goto switchD_0046f86f_caseD_3d;
        }
      }
      if (0x5d < uVar8) {
        if (uVar8 == 0x7d) goto LAB_0046f944;
        if (uVar8 != 0x7b) goto LAB_0046f910;
        goto LAB_0046fce0;
      }
      if (uVar8 == 0x5b) goto LAB_0046fcfe;
      if (uVar8 != 0x5d) {
        return 0;
      }
      goto LAB_0046fcf5;
    default:
      return 0;
    case 0x25:
switchD_0046f86f_caseD_25:
      return this->TokenTrans[8];
    case 0x26:
switchD_0046f86f_caseD_26:
      return this->TokenTrans[3];
    case 0x28:
switchD_0046f86f_caseD_28:
      return this->TokenTrans[0xb];
    case 0x29:
switchD_0046f86f_caseD_29:
      return this->TokenTrans[0xc];
    case 0x2a:
switchD_0046f86f_caseD_2a:
      return this->TokenTrans[6];
    case 0x2b:
switchD_0046f86f_caseD_2b:
      return this->TokenTrans[5];
    case 0x2c:
switchD_0046f86f_caseD_2c:
      return this->TokenTrans[0x10];
    case 0x2d:
switchD_0046f86f_caseD_2d:
      return this->TokenTrans[4];
    case 0x2f:
      goto switchD_0046f86f_caseD_2f;
    case 0x3a:
switchD_0046f86f_caseD_3a:
      return this->TokenTrans[0x15];
    case 0x3b:
switchD_0046f86f_caseD_3b:
      return this->TokenTrans[0x16];
    case 0x3c:
      *sourcep = pcVar10 + 2;
      if (pcVar10[1] != '<') {
        return 0;
      }
      *sourcep = pcVar10 + 3;
      if (pcVar10[2] == '=') {
        return this->TokenTrans[0x17];
      }
      break;
    case 0x3d:
switchD_0046f86f_caseD_3d:
      return this->TokenTrans[0x11];
    case 0x3e:
      *sourcep = pcVar10 + 2;
      if (pcVar10[1] != '>') {
        return 0;
      }
      *sourcep = pcVar10 + 3;
      if (pcVar10[2] == '=') {
        return this->TokenTrans[0x18];
      }
    }
    *sourcep = pcVar10 + 2;
    return 0;
  }
  local_8c = 0;
  uVar11 = 1;
  pcVar10 = *sourcep;
  local_88._0_1_ = cVar7;
  goto LAB_0046f9a7;
switchD_0046f86f_caseD_2f:
  pcVar4 = pcVar10 + 2;
  *sourcep = pcVar4;
  if (pcVar10[1] == '*') {
    while( true ) {
      while( true ) {
        pcVar5 = pcVar4 + 1;
        *sourcep = pcVar5;
        cVar7 = *pcVar4;
        if (cVar7 == '\0') {
          return 0;
        }
        if (cVar7 == '*') break;
        pcVar4 = pcVar5;
        if (cVar7 == '\n') {
          iVar6 = iVar6 + 1;
          this->SourceLine = iVar6;
        }
      }
      pcVar10 = pcVar4 + 2;
      *sourcep = pcVar10;
      if (*pcVar5 == '\0') {
        return 0;
      }
      if (*pcVar5 == '/') break;
      *sourcep = pcVar5;
      pcVar4 = pcVar5;
    }
  }
  else {
    if (pcVar10[1] != '/') {
      *sourcep = pcVar5;
      return this->TokenTrans[7];
    }
    do {
      pcVar10 = pcVar4 + 1;
      *sourcep = pcVar10;
      cVar7 = *pcVar4;
      if (cVar7 == '\0') goto LAB_0046f7ca;
      pcVar4 = pcVar10;
    } while (cVar7 != '\n');
    iVar6 = iVar6 + 1;
    this->SourceLine = iVar6;
  }
  goto LAB_0046f7ca;
  while( true ) {
    *(char *)((long)&local_88 + uVar11) = cVar7;
    uVar11 = uVar11 + 1;
    pcVar10 = pcVar10 + 1;
    if (uVar11 == 0x4f) break;
LAB_0046f9a7:
    *sourcep = pcVar10 + 1;
    cVar7 = *pcVar10;
    iVar2 = (int)cVar7;
    iVar6 = isalnum(iVar2);
    if ((iVar2 != 0x5f) && (iVar6 == 0)) goto LAB_0046f9d7;
  }
  uVar11 = 0x4f;
LAB_0046f9d7:
  *(undefined1 *)((long)&local_88 + (uVar11 & 0xffffffff)) = 0;
  if (((int)uVar11 == 0x4f) && (iVar6 = isalnum(iVar2), iVar6 != 0)) {
    pcVar10 = *sourcep;
    do {
      *sourcep = pcVar10 + 1;
      iVar6 = isalnum((int)*pcVar10);
      pcVar10 = pcVar10 + 1;
    } while (iVar6 != 0);
  }
  *sourcep = *sourcep + -1;
  piVar9 = &local_8c;
  iVar6 = (*this->_vptr_FParseContext[2])(this,&local_88,piVar9);
  if ((char)iVar6 == '\0') {
    bVar1 = FindSym(this,(char *)&local_88,&yylval->symval);
    if (bVar1) {
      yylval->val = yylval->symval->Value;
    }
    else {
      iVar6 = P_FindLineSpecial((char *)&local_88,(int *)0x0,(int *)0x0);
      yylval->val = iVar6;
      if (iVar6 == 0) {
        strcpy(yylval->sym,(char *)&local_88);
        piVar9 = this->TokenTrans + 0xd;
        goto LAB_0046fc85;
      }
    }
    piVar9 = this->TokenTrans + 9;
  }
LAB_0046fc85:
  return *piVar9;
}

Assistant:

int FParseContext::GetToken (char *&sourcep, FParseToken *yylval)
{
	char token[80];
	int toksize;
	int c;

loop:
	while (isspace (c = *sourcep++) && c != 0)
	{
		if (c == '\n')
			SourceLine++;
	}

	if (c == 0)
	{
		return 0;
	}
	if (isdigit (c))
	{
		int buildup = c - '0';
		if (c == '0')
		{
			c = *sourcep++;
			if (c == 'x' || c == 'X')
			{
				yylval->val = (int)strtol(sourcep, &sourcep, 16);
				return TokenTrans[NUM];
			}
			else
			{
				sourcep--;
			}
		}
		char *endp;

		sourcep--;
		yylval->val = (int)strtol(sourcep, &endp, 10);
		if (*endp == '.')
		{
			// It's a float
			yylval->fval = strtod(sourcep, &sourcep);
			return TokenTrans[FLOATVAL];
		}
		else
		{
			sourcep = endp;
			return TokenTrans[NUM];
		}
	}
	if (isalpha (c))
	{
		int buildup = 0;
		
		token[0] = c;
		toksize = 1;
		while (toksize < 79 && (isalnum (c = *sourcep++) || c == '_'))
		{
			token[toksize++] = c;
		}
		token[toksize] = 0;
		if (toksize == 79 && isalnum (c))
		{
			while (isalnum (c = *sourcep++))
				;
		}
		sourcep--;
		if (FindToken (token, &buildup))
		{
			return buildup;
		}
		if (FindSym (token, &yylval->symval))
		{
			yylval->val = yylval->symval->Value;
			return TokenTrans[NUM];
		}
		if ((yylval->val = P_FindLineSpecial(token)) != 0)
		{
			return TokenTrans[NUM];
		}
#if __GNUC__ == 4 && __GNUC_MINOR__ == 8
		// Work around GCC 4.8 bug 54570 causing release build crashes.
		asm("" : "+g" (yylval));
#endif
		strcpy (yylval->sym, token);
		return TokenTrans[SYM];
	}
	if (c == '/')
	{
		c = *sourcep++;
		if (c == '*')
		{
			for (;;)
			{
				while ((c = *sourcep++) != '*' && c != 0)
				{
					if (c == '\n')
						SourceLine++;
				}
				if (c == 0)
					return 0;
				if ((c = *sourcep++) == '/')
					goto loop;
				if (c == 0)
					return 0;
				sourcep--;
			}
		}
		else if (c == '/')
		{
			while ((c = *sourcep++) != '\n' && c != 0)
				;
			if (c == '\n')
				SourceLine++;
			else if (c == EOF)
				return 0;
			goto loop;
		}
		else
		{
			sourcep--;
			return TokenTrans[DIVIDE];
		}
	}
	if (c == '"')
	{
		int tokensize = 0;
		while ((c = *sourcep++) != '"' && c != 0)
		{
			yylval->string[tokensize++] = c;
		}
		yylval->string[tokensize] = 0;
		return TokenTrans[STRING];
	}
	if (c == '|')
	{
		c = *sourcep++;
		if (c == '=')
			return TokenTrans[OR_EQUAL];
		sourcep--;
		return TokenTrans[OR];
	}
	if (c == '<')
	{
		c = *sourcep++;
		if (c == '<')
		{
			c = *sourcep++;
			if (c == '=')
			{
				return TokenTrans[LSHASSIGN];
			}
			sourcep--;
			return 0;
		}
		c--;
		return 0;
	}
	if (c == '>')
	{
		c = *sourcep++;
		if (c == '>')
		{
			c = *sourcep++;
			if (c == '=')
			{
				return TokenTrans[RSHASSIGN];
			}
			sourcep--;
			return 0;
		}
		c--;
		return 0;
	}
	if (c == '#')
	{
		if (!strnicmp(sourcep, "include", 7))
		{
			sourcep+=7;
			return TokenTrans[INCLUDE];
		}
		if (!strnicmp(sourcep, "define", 6))
		{
			sourcep+=6;
			return TokenTrans[DEFINE];
		}
	}
	switch (c)
	{
	case '^': return TokenTrans[XOR];
	case '&': return TokenTrans[AND];
	case '-': return TokenTrans[MINUS];
	case '+': return TokenTrans[PLUS];
	case '*': return TokenTrans[MULTIPLY];
	case '%': return TokenTrans[MODULUS];
	case '(': return TokenTrans[LPAREN];
	case ')': return TokenTrans[RPAREN];
	case ',': return TokenTrans[COMMA];
	case '{': return TokenTrans[LBRACE];
	case '}': return TokenTrans[RBRACE];
	case '=': return TokenTrans[EQUALS];
	case ';': return TokenTrans[SEMICOLON];
	case ':': return TokenTrans[COLON];
	case '[': return TokenTrans[LBRACKET];
	case ']': return TokenTrans[RBRACKET];
	default:  return 0;
	}
}